

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O2

avl_node * avl_search_greater(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  avl_node *paVar1;
  int iVar2;
  avl_node *paVar3;
  avl_tree *paVar4;
  long lVar5;
  
  paVar4 = tree;
  paVar3 = (avl_node *)0x0;
  while( true ) {
    paVar1 = paVar4->root;
    if (paVar1 == (avl_node *)0x0) {
      if (paVar3 == (avl_node *)0x0) {
        paVar3 = (avl_node *)0x0;
      }
      else {
        iVar2 = (*func)(paVar3,node,tree->aux);
        if (iVar2 < 1) {
          paVar3 = avl_next(paVar3);
          return paVar3;
        }
      }
      return paVar3;
    }
    iVar2 = (*func)(paVar1,node,tree->aux);
    lVar5 = 8;
    if ((iVar2 < 1) && (lVar5 = 0x10, -1 < iVar2)) break;
    paVar4 = (avl_tree *)((long)&paVar1->parent + lVar5);
    paVar3 = paVar1;
  }
  return paVar1;
}

Assistant:

struct avl_node* avl_search_greater(struct avl_tree *tree,
                                    struct avl_node *node,
                                    avl_cmp_func *func)
// if an exact match does not exist,
// return smallest node greater than NODE
{
    struct avl_node *p = tree->root;
    struct avl_node *pp = NULL;
    int cmp;

    while(p)
    {
        cmp = func(p, node, tree->aux);
        pp = p;

        if (cmp > 0) {
            p = p->left;
        }else if (cmp < 0){
            p = p->right;
        }else {
            // search success
            return p;
        }
    }

    if (!pp) {
        return pp;
    }

    cmp = func(pp, node, tree->aux);
    if (cmp > 0) {
        return pp;
    }else{
        return avl_next(pp);
    }
}